

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::SetPrototype
          (PathTypeHandlerBase *this,DynamicObject *instance,RecyclableObject *newPrototype)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  BOOL BVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  PathTypeHandlerBase *this_00;
  TypeTransitionMap *oldTypeToPromotedTypeMap_00;
  TypeTransitionMap *local_40;
  TypeTransitionMap *oldTypeToPromotedTypeMap;
  
  BVar2 = Js::Type::IsExternal((instance->super_RecyclableObject).type.ptr);
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (BVar2 == 0) {
    pSVar1 = (((((newPrototype->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    local_40 = (TypeTransitionMap *)0x0;
    if (scriptContext == pSVar1) {
      iVar3 = (*(newPrototype->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x14])
                        (newPrototype,newPrototype,1,&local_40,0,scriptContext);
      oldTypeToPromotedTypeMap._4_4_ = CONCAT31((int3)((uint)iVar3 >> 8),iVar3 != 0);
    }
    else {
      oldTypeToPromotedTypeMap._4_4_ = 0;
    }
    pDVar4 = DynamicObject::GetTypeHandler(instance);
    this_00 = FromTypeHandler(pDVar4);
    oldTypeToPromotedTypeMap_00 = local_40;
    if (oldTypeToPromotedTypeMap._4_1_ == '\0') {
      oldTypeToPromotedTypeMap_00 = (TypeTransitionMap *)0x0;
    }
    SetPrototypeHelper(this_00,instance,newPrototype,oldTypeToPromotedTypeMap_00,
                       scriptContext == pSVar1,scriptContext);
    return;
  }
  scriptContext->convertPathToDictionaryProtoCount =
       scriptContext->convertPathToDictionaryProtoCount + 1;
  pDVar4 = TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),false)
  ;
  (*pDVar4->_vptr_DynamicTypeHandler[0x49])
            (pDVar4,instance,newPrototype,pDVar4->_vptr_DynamicTypeHandler[0x49]);
  return;
}

Assistant:

void PathTypeHandlerBase::SetPrototype(DynamicObject* instance, RecyclableObject* newPrototype)
    {
        // No typesharing for ExternalType
        if (instance->GetType()->IsExternal())
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryProtoCount++;
#endif
            TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetPrototype(instance, newPrototype);
            return;
        }

        ScriptContext* scriptContext = instance->GetScriptContext();
        bool useCache = scriptContext == newPrototype->GetScriptContext();

        TypeTransitionMap * oldTypeToPromotedTypeMap = nullptr;
        bool hasMap = false;
        if (useCache)
        {
            hasMap = newPrototype->GetInternalProperty(newPrototype, Js::InternalPropertyIds::TypeOfPrototypeObjectDictionary, (Js::Var*)&oldTypeToPromotedTypeMap, nullptr, scriptContext);
        }

        PathTypeHandlerBase *_this = PathTypeHandlerBase::FromTypeHandler(instance->GetTypeHandler());
        _this->SetPrototypeHelper(instance, newPrototype, hasMap ? oldTypeToPromotedTypeMap : nullptr, useCache, scriptContext);
    }